

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

int create_framebuffers(Init *init,RenderData *data)

{
  RenderData *pRVar1;
  VkResult VVar2;
  vector<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_> *this;
  size_type __new_size;
  VkImageView pVVar3;
  reference ppVVar4;
  reference pFramebuffer;
  undefined1 local_e0 [8];
  VkFramebufferCreateInfo framebuffer_info;
  VkImageView attachments [1];
  size_t i;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> local_70;
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> local_58;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> local_38;
  RenderData *local_20;
  RenderData *data_local;
  Init *init_local;
  
  local_20 = data;
  data_local = (RenderData *)init;
  vkb::Swapchain::get_images(&local_58,&init->swapchain);
  vkb::Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::value(&local_38,&local_58);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::operator=
            (&local_20->swapchain_images,&local_38);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~vector(&local_38);
  vkb::Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::~Result(&local_58);
  vkb::Swapchain::get_image_views
            ((Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)&i,
             (Swapchain *)&data_local[0x1f].render_pass);
  vkb::Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>::value
            (&local_70,(Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)&i
            );
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::operator=
            (&local_20->swapchain_image_views,&local_70);
  std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::~vector(&local_70);
  vkb::Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>::~Result
            ((Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> *)&i);
  this = &local_20->framebuffers;
  __new_size = std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::size
                         (&local_20->swapchain_image_views);
  std::vector<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>::resize(this,__new_size);
  attachments[0] = (VkImageView)0x0;
  while( true ) {
    pVVar3 = (VkImageView)
             std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::size
                       (&local_20->swapchain_image_views);
    if (pVVar3 <= attachments[0]) {
      return 0;
    }
    ppVVar4 = std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::operator[]
                        (&local_20->swapchain_image_views,(size_type)attachments[0]);
    framebuffer_info._56_8_ = *ppVVar4;
    memset(local_e0,0,0x40);
    local_e0._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
    framebuffer_info._16_8_ = local_20->render_pass;
    framebuffer_info.renderPass._0_4_ = 1;
    framebuffer_info._32_8_ = &framebuffer_info.layers;
    framebuffer_info.pAttachments._0_4_ =
         *(undefined4 *)
          &data_local[0x1f].command_buffers.
           super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    framebuffer_info.pAttachments._4_4_ =
         *(undefined4 *)
          ((long)&data_local[0x1f].command_buffers.
                  super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + 4);
    framebuffer_info.width = 1;
    pRVar1 = data_local + 0xb;
    pFramebuffer = std::vector<VkFramebuffer_T_*,_std::allocator<VkFramebuffer_T_*>_>::operator[]
                             (&local_20->framebuffers,(size_type)attachments[0]);
    VVar2 = vkb::DispatchTable::createFramebuffer
                      ((DispatchTable *)
                       &(pRVar1->swapchain_image_views).
                        super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
                       (VkFramebufferCreateInfo *)local_e0,(VkAllocationCallbacks *)0x0,pFramebuffer
                      );
    if (VVar2 != VK_SUCCESS) break;
    attachments[0] = attachments[0] + 1;
  }
  return -1;
}

Assistant:

int create_framebuffers(Init& init, RenderData& data) {
    data.swapchain_images = init.swapchain.get_images().value();
    data.swapchain_image_views = init.swapchain.get_image_views().value();

    data.framebuffers.resize(data.swapchain_image_views.size());

    for (size_t i = 0; i < data.swapchain_image_views.size(); i++) {
        VkImageView attachments[] = { data.swapchain_image_views[i] };

        VkFramebufferCreateInfo framebuffer_info = {};
        framebuffer_info.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        framebuffer_info.renderPass = data.render_pass;
        framebuffer_info.attachmentCount = 1;
        framebuffer_info.pAttachments = attachments;
        framebuffer_info.width = init.swapchain.extent.width;
        framebuffer_info.height = init.swapchain.extent.height;
        framebuffer_info.layers = 1;

        if (init.disp.createFramebuffer(&framebuffer_info, nullptr, &data.framebuffers[i]) != VK_SUCCESS) {
            return -1; // failed to create framebuffer
        }
    }
    return 0;
}